

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void twice_close_cb(uv_handle_t *handle)

{
  int iVar1;
  uint uVar2;
  uv_handle_type uVar3;
  int iVar4;
  size_t sVar5;
  uv_loop_t *loop;
  int *piVar6;
  uv_loop_t *loop_00;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_1eb8 [32];
  uv_tty_t uStack_1e98;
  uv_tty_t uStack_1d80;
  uv_loop_t uStack_1c68;
  uv_loop_t *puStack_1940;
  code *pcStack_1938;
  long lStack_1930;
  long lStack_1928;
  undefined1 auStack_1920 [280];
  undefined1 auStack_1808 [280];
  undefined1 auStack_16f0 [1088];
  uv_loop_t *puStack_12b0;
  long lStack_12a0;
  long lStack_1298;
  uint uStack_1290;
  uint uStack_128c;
  uv_tty_t uStack_1288;
  uv_tty_t uStack_1170;
  uv_handle_t *puStack_1058;
  undefined8 uStack_1028;
  uv_handle_t auStack_1020 [64];
  uv_handle_t *puStack_20;
  undefined8 local_18;
  long local_10;
  
  puStack_20 = (uv_handle_t *)0x1d483a;
  puts("TWICE_CLOSE_CB");
  if (handle == (uv_handle_t *)0x0) {
    puStack_20 = (uv_handle_t *)0x1d4872;
    twice_close_cb_cold_2();
  }
  else {
    puStack_20 = (uv_handle_t *)0x1d4847;
    iVar1 = uv_is_active(handle);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 == 0) {
      twice_close_cb_called = twice_close_cb_called + 1;
      return;
    }
  }
  puStack_20 = (uv_handle_t *)0x1d487f;
  twice_close_cb_cold_1();
  uStack_1028 = 0x1000;
  auStack_1020[0].data._0_1_ = 0;
  puStack_20 = handle;
  sVar5 = strlen((char *)auStack_1020);
  if (sVar5 == 0) {
    iVar1 = uv_os_tmpdir((char *)auStack_1020,&uStack_1028);
    if (iVar1 != 0) goto LAB_001d4a84;
    handle = auStack_1020;
    sVar5 = strlen((char *)handle);
    if (sVar5 != uStack_1028) goto LAB_001d4a93;
    if ((long)uStack_1028 < 1) goto LAB_001d4aa2;
    if (*(char *)((long)&auStack_1020[0].data + uStack_1028) != '\0') goto LAB_001d4ab1;
    if ((uStack_1028 < 2) || (*(char *)((uStack_1028 - 1) + (long)handle) != '/')) {
      uStack_1028 = 1;
      iVar1 = uv_os_tmpdir((char *)auStack_1020,&uStack_1028);
      if (iVar1 != -0x69) goto LAB_001d4ac0;
      if ((long)uStack_1028 < 2) goto LAB_001d4acf;
      iVar1 = uv_os_tmpdir((char *)0x0,&uStack_1028);
      if (iVar1 != -0x16) goto LAB_001d4ade;
      iVar1 = uv_os_tmpdir((char *)auStack_1020,(size_t *)0x0);
      if (iVar1 != -0x16) goto LAB_001d4aed;
      uStack_1028 = 0;
      iVar1 = uv_os_tmpdir((char *)auStack_1020,&uStack_1028);
      if (iVar1 == -0x16) {
        return;
      }
      goto LAB_001d4afc;
    }
  }
  else {
    run_test_tmpdir_cold_1();
LAB_001d4a84:
    run_test_tmpdir_cold_2();
LAB_001d4a93:
    run_test_tmpdir_cold_3();
LAB_001d4aa2:
    run_test_tmpdir_cold_4();
LAB_001d4ab1:
    run_test_tmpdir_cold_5();
LAB_001d4ac0:
    run_test_tmpdir_cold_6();
LAB_001d4acf:
    run_test_tmpdir_cold_7();
LAB_001d4ade:
    run_test_tmpdir_cold_8();
LAB_001d4aed:
    run_test_tmpdir_cold_9();
LAB_001d4afc:
    run_test_tmpdir_cold_10();
  }
  run_test_tmpdir_cold_11();
  puStack_12b0 = (uv_loop_t *)0x1d4b2c;
  puStack_1058 = handle;
  loop = uv_default_loop();
  puStack_12b0 = (uv_loop_t *)0x1d4b41;
  uVar2 = open64("/dev/tty",0,0);
  if ((int)uVar2 < 0) {
    puStack_12b0 = (uv_loop_t *)0x1d4f74;
    run_test_tty_cold_24();
    return;
  }
  piVar6 = (int *)(ulong)uVar2;
  puStack_12b0 = (uv_loop_t *)0x1d4b61;
  iVar1 = open64("/dev/tty",1,0);
  if (iVar1 < 0) {
    puStack_12b0 = (uv_loop_t *)0x1d4f7e;
    run_test_tty_cold_23();
    return;
  }
  uStack_1288.data = (void *)0x0;
  uStack_1170.data = (void *)0x0;
  puStack_12b0 = (uv_loop_t *)0x1d4bce;
  uVar3 = uv_guess_handle(-1);
  uStack_1288.data = (void *)(ulong)uVar3;
  if (uStack_1170.data == uStack_1288.data) {
    uStack_1170.data = (void *)0xe;
    puStack_12b0 = (uv_loop_t *)0x1d4bfc;
    uVar3 = uv_guess_handle(uVar2);
    uStack_1288.data = (void *)(ulong)uVar3;
    if (uStack_1170.data != uStack_1288.data) goto LAB_001d4fb9;
    uStack_1170.data = (void *)0xe;
    puStack_12b0 = (uv_loop_t *)0x1d4c29;
    uVar3 = uv_guess_handle(iVar1);
    uStack_1288.data = (void *)(ulong)uVar3;
    if (uStack_1170.data != uStack_1288.data) goto LAB_001d4fcb;
    puStack_12b0 = (uv_loop_t *)0x1d4c5b;
    iVar4 = uv_tty_init(loop,&uStack_1170,uVar2,1);
    uStack_1288.data = (void *)(long)iVar4;
    lStack_12a0 = 0;
    if (uStack_1288.data != (void *)0x0) goto LAB_001d4fdd;
    puStack_12b0 = (uv_loop_t *)0x1d4c88;
    iVar4 = uv_is_readable((uv_stream_t *)&uStack_1170);
    if (iVar4 == 0) goto LAB_001d4fec;
    puStack_12b0 = (uv_loop_t *)0x1d4c9d;
    iVar4 = uv_is_writable((uv_stream_t *)&uStack_1170);
    if (iVar4 != 0) goto LAB_001d4ff1;
    puStack_12b0 = (uv_loop_t *)0x1d4cb6;
    iVar1 = uv_tty_init(loop,&uStack_1288,iVar1,0);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4ff6;
    puStack_12b0 = (uv_loop_t *)0x1d4ce0;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_1288);
    if (iVar1 != 0) goto LAB_001d5005;
    puStack_12b0 = (uv_loop_t *)0x1d4cf2;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_1288);
    if (iVar1 == 0) goto LAB_001d500a;
    puStack_12b0 = (uv_loop_t *)0x1d4d0e;
    iVar1 = uv_tty_get_winsize(&uStack_1288,(int *)&uStack_128c,(int *)&uStack_1290);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d500f;
    puStack_12b0 = (uv_loop_t *)0x1d4d44;
    printf("width=%d height=%d\n",(ulong)uStack_128c,(ulong)uStack_1290);
    if (uStack_128c == 0 && uStack_1290 == 0) {
      puStack_12b0 = (uv_loop_t *)0x1d4d64;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      puStack_12b0 = (uv_loop_t *)0x1d4d6e;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_12a0 = 0;
      puStack_12b0 = (uv_loop_t *)0x1d4d7f;
      iVar1 = uv_loop_close(loop);
      lStack_1298 = (long)iVar1;
      if (lStack_12a0 == lStack_1298) {
        puStack_12b0 = (uv_loop_t *)0x1d4d9b;
        uv_library_shutdown();
        return;
      }
      goto LAB_001d501e;
    }
    lStack_1298 = 0;
    lStack_12a0 = (long)(int)uStack_128c;
    if ((long)(int)uStack_128c < 1) goto LAB_001d502d;
    lStack_12a0 = (long)(int)uStack_1290;
    lStack_1298 = 0;
    if (lStack_12a0 < 1) goto LAB_001d503c;
    puStack_12b0 = (uv_loop_t *)0x1d4df6;
    iVar1 = uv_tty_set_mode(&uStack_1170,UV_TTY_MODE_RAW);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d504b;
    puStack_12b0 = (uv_loop_t *)0x1d4e25;
    iVar1 = uv_tty_set_mode(&uStack_1170,UV_TTY_MODE_NORMAL);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d505a;
    puStack_12b0 = (uv_loop_t *)0x1d4e4a;
    piVar6 = __errno_location();
    *piVar6 = 0;
    puStack_12b0 = (uv_loop_t *)0x1d4e58;
    iVar1 = uv_tty_reset_mode();
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d5069;
    puStack_12b0 = (uv_loop_t *)0x1d4e7d;
    iVar1 = uv_tty_reset_mode();
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d5078;
    puStack_12b0 = (uv_loop_t *)0x1d4ea2;
    iVar1 = uv_tty_reset_mode();
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d5087;
    lStack_12a0 = (long)*piVar6;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d5096;
    piVar6 = (int *)0x0;
    puStack_12b0 = (uv_loop_t *)0x1d4ef5;
    uv_close((uv_handle_t *)&uStack_1170,(uv_close_cb)0x0);
    puStack_12b0 = (uv_loop_t *)0x1d4f01;
    uv_close((uv_handle_t *)&uStack_1288,(uv_close_cb)0x0);
    puStack_12b0 = (uv_loop_t *)0x1d4f0b;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_12b0 = (uv_loop_t *)0x1d4f10;
    loop = uv_default_loop();
    puStack_12b0 = (uv_loop_t *)0x1d4f24;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_12b0 = (uv_loop_t *)0x1d4f2e;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_12a0 = 0;
    puStack_12b0 = (uv_loop_t *)0x1d4f3c;
    loop_00 = uv_default_loop();
    puStack_12b0 = (uv_loop_t *)0x1d4f44;
    iVar1 = uv_loop_close(loop_00);
    lStack_1298 = (long)iVar1;
    if (lStack_12a0 == lStack_1298) {
      puStack_12b0 = (uv_loop_t *)0x1d4f60;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_12b0 = (uv_loop_t *)0x1d4fb9;
    run_test_tty_cold_1();
LAB_001d4fb9:
    puStack_12b0 = (uv_loop_t *)0x1d4fcb;
    run_test_tty_cold_2();
LAB_001d4fcb:
    puStack_12b0 = (uv_loop_t *)0x1d4fdd;
    run_test_tty_cold_3();
LAB_001d4fdd:
    puStack_12b0 = (uv_loop_t *)0x1d4fec;
    run_test_tty_cold_4();
LAB_001d4fec:
    puStack_12b0 = (uv_loop_t *)0x1d4ff1;
    run_test_tty_cold_20();
LAB_001d4ff1:
    puStack_12b0 = (uv_loop_t *)0x1d4ff6;
    run_test_tty_cold_5();
LAB_001d4ff6:
    puStack_12b0 = (uv_loop_t *)0x1d5005;
    run_test_tty_cold_6();
LAB_001d5005:
    puStack_12b0 = (uv_loop_t *)0x1d500a;
    run_test_tty_cold_7();
LAB_001d500a:
    puStack_12b0 = (uv_loop_t *)0x1d500f;
    run_test_tty_cold_19();
LAB_001d500f:
    puStack_12b0 = (uv_loop_t *)0x1d501e;
    run_test_tty_cold_8();
LAB_001d501e:
    puStack_12b0 = (uv_loop_t *)0x1d502d;
    run_test_tty_cold_18();
LAB_001d502d:
    puStack_12b0 = (uv_loop_t *)0x1d503c;
    run_test_tty_cold_9();
LAB_001d503c:
    puStack_12b0 = (uv_loop_t *)0x1d504b;
    run_test_tty_cold_10();
LAB_001d504b:
    puStack_12b0 = (uv_loop_t *)0x1d505a;
    run_test_tty_cold_11();
LAB_001d505a:
    puStack_12b0 = (uv_loop_t *)0x1d5069;
    run_test_tty_cold_12();
LAB_001d5069:
    puStack_12b0 = (uv_loop_t *)0x1d5078;
    run_test_tty_cold_13();
LAB_001d5078:
    puStack_12b0 = (uv_loop_t *)0x1d5087;
    run_test_tty_cold_14();
LAB_001d5087:
    puStack_12b0 = (uv_loop_t *)0x1d5096;
    run_test_tty_cold_15();
LAB_001d5096:
    puStack_12b0 = (uv_loop_t *)0x1d50a5;
    run_test_tty_cold_16();
  }
  puStack_12b0 = (uv_loop_t *)run_test_tty_file;
  run_test_tty_cold_17();
  pcStack_1938 = (code *)0x1d50c9;
  puStack_12b0 = loop;
  iVar1 = uv_loop_init((uv_loop_t *)(auStack_16f0 + 0x118));
  auStack_16f0._0_8_ = SEXT48(iVar1);
  auStack_1808._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_16f0._0_8_ == (uv__queue *)0x0) {
    pcStack_1938 = (code *)0x1d5105;
    uVar2 = open64("test/fixtures/empty_file",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d5138;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ != auStack_1920._0_8_) goto LAB_001d560f;
      pcStack_1938 = (code *)0x1d5159;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ != (uv__queue *)0x0) goto LAB_001d5621;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d51a7;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ == auStack_1920._0_8_) goto LAB_001d51c1;
      goto LAB_001d5645;
    }
LAB_001d51c1:
    pcStack_1938 = (code *)0x1d51d1;
    uVar2 = open64("/dev/random",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d5200;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ != auStack_1920._0_8_) goto LAB_001d5633;
      pcStack_1938 = (code *)0x1d5221;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ == (uv__queue *)0x0) goto LAB_001d5247;
      goto LAB_001d5657;
    }
LAB_001d5247:
    pcStack_1938 = (code *)0x1d5257;
    uVar2 = open64("/dev/zero",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d5286;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ != auStack_1920._0_8_) goto LAB_001d5669;
      pcStack_1938 = (code *)0x1d52a7;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ == (uv__queue *)0x0) goto LAB_001d52cd;
      goto LAB_001d567b;
    }
LAB_001d52cd:
    pcStack_1938 = (code *)0x1d52e0;
    uVar2 = open64("/dev/tty",2);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      pcStack_1938 = (code *)0x1d5307;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ != (uv__queue *)0x0) goto LAB_001d568d;
      pcStack_1938 = (code *)0x1d5334;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ != (uv__queue *)0x0) goto LAB_001d569f;
      pcStack_1938 = (code *)0x1d5367;
      iVar1 = uv_is_readable((uv_stream_t *)auStack_16f0);
      if (iVar1 == 0) goto LAB_001d56b1;
      pcStack_1938 = (code *)0x1d537c;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_16f0);
      if (iVar1 == 0) goto LAB_001d56b6;
      loop = (uv_loop_t *)auStack_16f0;
      pcStack_1938 = (code *)0x1d5396;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_1938 = (code *)0x1d539e;
      iVar1 = uv_is_readable((uv_stream_t *)loop);
      if (iVar1 != 0) goto LAB_001d56c8;
      pcStack_1938 = (code *)0x1d53b3;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_16f0);
      if (iVar1 == 0) goto LAB_001d53bb;
      goto LAB_001d56da;
    }
LAB_001d53bb:
    pcStack_1938 = (code *)0x1d53cb;
    uVar2 = open64("/dev/tty",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      pcStack_1938 = (code *)0x1d53f2;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_1808,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      lStack_1930 = 0;
      if ((uv__queue *)auStack_1920._0_8_ != (uv__queue *)0x0) goto LAB_001d56bb;
      pcStack_1938 = (code *)0x1d5417;
      iVar1 = close(uVar2);
      auStack_1920._0_8_ = SEXT48(iVar1);
      lStack_1930 = 0;
      if ((uv__queue *)auStack_1920._0_8_ != (uv__queue *)0x0) goto LAB_001d56cd;
      pcStack_1938 = (code *)0x1d5442;
      iVar1 = uv_is_readable((uv_stream_t *)auStack_1808);
      if (iVar1 == 0) goto LAB_001d56df;
      pcStack_1938 = (code *)0x1d5457;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_1808);
      if (iVar1 != 0) goto LAB_001d56e4;
      loop = (uv_loop_t *)auStack_1808;
      pcStack_1938 = (code *)0x1d5471;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_1938 = (code *)0x1d5479;
      iVar1 = uv_is_readable((uv_stream_t *)loop);
      if (iVar1 != 0) goto LAB_001d56f6;
      pcStack_1938 = (code *)0x1d548e;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_1808);
      if (iVar1 == 0) goto LAB_001d5496;
      goto LAB_001d5708;
    }
LAB_001d5496:
    pcStack_1938 = (code *)0x1d54a9;
    uVar2 = open64("/dev/tty",1);
    if (uVar2 == 0xffffffff) {
LAB_001d5562:
      pcStack_1938 = (code *)0x1d5571;
      iVar1 = uv_run((uv_loop_t *)(auStack_16f0 + 0x118),UV_RUN_DEFAULT);
      lStack_1930 = (long)iVar1;
      lStack_1928 = 0;
      if (lStack_1930 != 0) goto LAB_001d55f5;
      loop = (uv_loop_t *)(auStack_16f0 + 0x118);
      pcStack_1938 = (code *)0x1d55a4;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_1938 = (code *)0x1d55ae;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_1930 = 0;
      pcStack_1938 = (code *)0x1d55be;
      iVar1 = uv_loop_close(loop);
      lStack_1928 = (long)iVar1;
      if (lStack_1930 == lStack_1928) {
        pcStack_1938 = (code *)0x1d55d5;
        uv_library_shutdown();
        return;
      }
      goto LAB_001d5602;
    }
    loop = (uv_loop_t *)(ulong)uVar2;
    pcStack_1938 = (code *)0x1d54ca;
    iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_1920,uVar2,0);
    lStack_1930 = (long)iVar1;
    lStack_1928 = 0;
    if (lStack_1930 != 0) goto LAB_001d56e9;
    pcStack_1938 = (code *)0x1d54ef;
    iVar1 = close(uVar2);
    lStack_1930 = (long)iVar1;
    lStack_1928 = 0;
    if (lStack_1930 != 0) goto LAB_001d56fb;
    pcStack_1938 = (code *)0x1d5517;
    iVar1 = uv_is_readable((uv_stream_t *)auStack_1920);
    if (iVar1 != 0) goto LAB_001d570d;
    pcStack_1938 = (code *)0x1d5529;
    iVar1 = uv_is_writable((uv_stream_t *)auStack_1920);
    if (iVar1 == 0) goto LAB_001d5712;
    loop = (uv_loop_t *)auStack_1920;
    pcStack_1938 = (code *)0x1d5540;
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    pcStack_1938 = (code *)0x1d5548;
    iVar1 = uv_is_readable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_001d5717;
    pcStack_1938 = (code *)0x1d555a;
    iVar1 = uv_is_writable((uv_stream_t *)auStack_1920);
    if (iVar1 == 0) goto LAB_001d5562;
  }
  else {
    pcStack_1938 = (code *)0x1d55f5;
    run_test_tty_file_cold_1();
LAB_001d55f5:
    pcStack_1938 = (code *)0x1d5602;
    run_test_tty_file_cold_27();
LAB_001d5602:
    pcStack_1938 = (code *)0x1d560f;
    run_test_tty_file_cold_28();
LAB_001d560f:
    pcStack_1938 = (code *)0x1d5621;
    run_test_tty_file_cold_2();
LAB_001d5621:
    pcStack_1938 = (code *)0x1d5633;
    run_test_tty_file_cold_3();
LAB_001d5633:
    pcStack_1938 = (code *)0x1d5645;
    run_test_tty_file_cold_5();
LAB_001d5645:
    pcStack_1938 = (code *)0x1d5657;
    run_test_tty_file_cold_4();
LAB_001d5657:
    pcStack_1938 = (code *)0x1d5669;
    run_test_tty_file_cold_6();
LAB_001d5669:
    pcStack_1938 = (code *)0x1d567b;
    run_test_tty_file_cold_7();
LAB_001d567b:
    pcStack_1938 = (code *)0x1d568d;
    run_test_tty_file_cold_8();
LAB_001d568d:
    pcStack_1938 = (code *)0x1d569f;
    run_test_tty_file_cold_9();
LAB_001d569f:
    pcStack_1938 = (code *)0x1d56b1;
    run_test_tty_file_cold_10();
LAB_001d56b1:
    pcStack_1938 = (code *)0x1d56b6;
    run_test_tty_file_cold_14();
LAB_001d56b6:
    pcStack_1938 = (code *)0x1d56bb;
    run_test_tty_file_cold_13();
LAB_001d56bb:
    pcStack_1938 = (code *)0x1d56c8;
    run_test_tty_file_cold_15();
LAB_001d56c8:
    pcStack_1938 = (code *)0x1d56cd;
    run_test_tty_file_cold_11();
LAB_001d56cd:
    pcStack_1938 = (code *)0x1d56da;
    run_test_tty_file_cold_16();
LAB_001d56da:
    pcStack_1938 = (code *)0x1d56df;
    run_test_tty_file_cold_12();
LAB_001d56df:
    pcStack_1938 = (code *)0x1d56e4;
    run_test_tty_file_cold_20();
LAB_001d56e4:
    pcStack_1938 = (code *)0x1d56e9;
    run_test_tty_file_cold_17();
LAB_001d56e9:
    pcStack_1938 = (code *)0x1d56f6;
    run_test_tty_file_cold_21();
LAB_001d56f6:
    pcStack_1938 = (code *)0x1d56fb;
    run_test_tty_file_cold_18();
LAB_001d56fb:
    pcStack_1938 = (code *)0x1d5708;
    run_test_tty_file_cold_22();
LAB_001d5708:
    pcStack_1938 = (code *)0x1d570d;
    run_test_tty_file_cold_19();
LAB_001d570d:
    pcStack_1938 = (code *)0x1d5712;
    run_test_tty_file_cold_23();
LAB_001d5712:
    pcStack_1938 = (code *)0x1d5717;
    run_test_tty_file_cold_26();
LAB_001d5717:
    pcStack_1938 = (code *)0x1d571c;
    run_test_tty_file_cold_24();
  }
  pcStack_1938 = run_test_tty_pty;
  run_test_tty_file_cold_25();
  handle_00 = (uv_handle_t *)auStack_1eb8;
  puStack_1940 = loop;
  pcStack_1938 = (code *)piVar6;
  iVar1 = uv_loop_init(&uStack_1c68);
  uStack_1e98.data = (void *)(long)iVar1;
  uStack_1d80.data = (void *)0x0;
  if ((uv__queue *)uStack_1e98.data == (uv__queue *)0x0) {
    iVar1 = openpty(auStack_1eb8 + 0x14,auStack_1eb8 + 0x10,0,0,auStack_1eb8 + 0x18);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return;
    }
    iVar1 = uv_tty_init(&uStack_1c68,&uStack_1d80,auStack_1eb8._16_4_,0);
    uStack_1e98.data = (void *)(long)iVar1;
    auStack_1eb8._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_1e98.data != (uv__queue *)0x0) goto LAB_001d597f;
    iVar1 = uv_tty_init(&uStack_1c68,(uv_tty_t *)(auStack_1eb8 + 0x20),auStack_1eb8._20_4_,0);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d598c;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_1d80);
    if (iVar1 == 0) goto LAB_001d5999;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_1d80);
    if (iVar1 == 0) goto LAB_001d599e;
    iVar1 = uv_is_readable((uv_stream_t *)(auStack_1eb8 + 0x20));
    if (iVar1 == 0) goto LAB_001d59a3;
    iVar1 = uv_is_writable((uv_stream_t *)(auStack_1eb8 + 0x20));
    if (iVar1 == 0) goto LAB_001d59a8;
    auStack_1eb8._0_8_ = ZEXT48(uStack_1d80.flags & 0x100000);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d59ad;
    if ((uStack_1e98.flags._2_1_ & 0x10) == 0) goto LAB_001d59ba;
    iVar1 = close(auStack_1eb8._16_4_);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d59bf;
    uv_close((uv_handle_t *)&uStack_1d80,(uv_close_cb)0x0);
    iVar1 = close(auStack_1eb8._20_4_);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d59cc;
    uv_close((uv_handle_t *)(auStack_1eb8 + 0x20),(uv_close_cb)0x0);
    iVar1 = uv_run(&uStack_1c68,UV_RUN_DEFAULT);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(&uStack_1c68,close_walk_cb,(void *)0x0);
      uv_run(&uStack_1c68,UV_RUN_DEFAULT);
      auStack_1eb8._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(&uStack_1c68);
      auStack_1eb8._8_8_ = SEXT48(iVar1);
      if (auStack_1eb8._0_8_ == auStack_1eb8._8_8_) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001d59e6;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d597f:
    run_test_tty_pty_cold_3();
LAB_001d598c:
    run_test_tty_pty_cold_4();
LAB_001d5999:
    run_test_tty_pty_cold_14();
LAB_001d599e:
    run_test_tty_pty_cold_13();
LAB_001d59a3:
    run_test_tty_pty_cold_12();
LAB_001d59a8:
    run_test_tty_pty_cold_11();
LAB_001d59ad:
    run_test_tty_pty_cold_5();
LAB_001d59ba:
    run_test_tty_pty_cold_10();
LAB_001d59bf:
    run_test_tty_pty_cold_6();
LAB_001d59cc:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d59e6:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 == 0) {
    uv_close(handle_00,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void twice_close_cb(uv_handle_t* handle) {
  printf("TWICE_CLOSE_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active(handle));

  twice_close_cb_called++;
}